

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O2

void __thiscall blcl::net::connection<MsgType>::read_body(connection<MsgType> *this)

{
  anon_class_8_1_8991fb9c_for_handler_ local_18;
  mutable_buffers_1 local_10;
  
  local_10.super_mutable_buffer.data_ =
       (this->current_incoming_message_).body.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_10.super_mutable_buffer.size_ =
       (long)(this->current_incoming_message_).body.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_10.super_mutable_buffer.data_;
  local_18.this = this;
  asio::
  async_read<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::mutable_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_connection_h:119:17)>
            (&this->socket_,&local_10,&local_18,0);
  return;
}

Assistant:

void read_body() {
            asio::async_read(socket_, asio::buffer(current_incoming_message_.body.data(), current_incoming_message_.size()),
                [this](std::error_code ec, std::size_t length) {
                    if (!ec) {
                        add_to_incoming_messages_queue();
                    } else {
                        std::cout << "[WARN] " << id_ << ": Read body failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }